

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O3

void __thiscall Minisat::DoubleOption::giveRndValue(DoubleOption *this,string *optionText)

{
  undefined8 *puVar1;
  double dVar2;
  int iVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  ulong uVar7;
  double dVar8;
  ostringstream strs;
  ulong *local_210;
  long local_208;
  ulong local_200;
  long lStack_1f8;
  undefined8 *local_1f0;
  undefined8 local_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  ulong *local_1d0;
  long local_1c8;
  ulong local_1c0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1b0;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  dVar8 = (this->range).begin;
  if ((this->range).begin_inclusive == false) {
    dVar8 = dVar8 + 1e-06;
  }
  iVar3 = rand();
  dVar8 = (double)iVar3 + dVar8;
  dVar2 = (this->range).end;
  if (dVar2 < dVar8) {
    do {
      dVar8 = dVar8 - (dVar2 - (this->range).begin);
    } while (dVar2 < dVar8);
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  std::ostream::_M_insert<double>(dVar8);
  std::operator+(&local_1b0,"-",optionText);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_1b0);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_200 = *puVar6;
    lStack_1f8 = plVar4[3];
    local_210 = &local_200;
  }
  else {
    local_200 = *puVar6;
    local_210 = (ulong *)*plVar4;
  }
  local_208 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::stringbuf::str();
  uVar7 = 0xf;
  if (local_210 != &local_200) {
    uVar7 = local_200;
  }
  if (uVar7 < (ulong)(local_1c8 + local_208)) {
    uVar7 = 0xf;
    if (local_1d0 != local_1c0) {
      uVar7 = local_1c0[0];
    }
    if ((ulong)(local_1c8 + local_208) <= uVar7) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_1d0,0,(char *)0x0,(ulong)local_210);
      goto LAB_0011f352;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_210,(ulong)local_1d0);
LAB_0011f352:
  local_1f0 = &local_1e0;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_1e0 = *puVar1;
    uStack_1d8 = puVar5[3];
  }
  else {
    local_1e0 = *puVar1;
    local_1f0 = (undefined8 *)*puVar5;
  }
  local_1e8 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  std::__cxx11::string::operator=((string *)optionText,(string *)&local_1f0);
  if (local_1f0 != &local_1e0) {
    operator_delete(local_1f0);
  }
  if (local_1d0 != local_1c0) {
    operator_delete(local_1d0);
  }
  if (local_210 != &local_200) {
    operator_delete(local_210);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1b0._M_dataplus._M_p != &local_1b0.field_2) {
    operator_delete(local_1b0._M_dataplus._M_p);
  }
  std::__cxx11::ostringstream::~ostringstream(local_190);
  std::ios_base::~ios_base(local_120);
  return;
}

Assistant:

void giveRndValue(std::string &optionText)
    {
        double rndV = range.begin_inclusive ? range.begin : range.begin + 0.000001;
        rndV += rand();
        while (rndV > range.end) {
            rndV -= range.end - range.begin;
        }
        std::ostringstream strs;
        strs << rndV;
        optionText = "-" + optionText + "=" + strs.str();
    }